

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ApprovalTestNamer::getFullFileName
          (ApprovalTestNamer *this,string *approved,string *extensionWithDot)

{
  ostream *poVar1;
  string *in_RCX;
  string *in_RDX;
  string *in_RDI;
  stringstream ext;
  string local_1f8 [16];
  ApprovalTestNamer *in_stack_fffffffffffffe18;
  string local_1c8 [32];
  ApprovalTestNamer *in_stack_fffffffffffffe58;
  ostream local_198 [376];
  string *local_20;
  string *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe58);
  getDirectory_abi_cxx11_(in_stack_fffffffffffffe18);
  poVar1 = ::std::operator<<(local_198,local_1c8);
  getOutputFileBaseName_abi_cxx11_(in_stack_fffffffffffffe58);
  poVar1 = ::std::operator<<(poVar1,local_1f8);
  poVar1 = ::std::operator<<(poVar1,local_18);
  ::std::operator<<(poVar1,local_20);
  ::std::__cxx11::string::~string(local_1f8);
  ::std::__cxx11::string::~string(local_1c8);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe58);
  return in_RDI;
}

Assistant:

std::string
    ApprovalTestNamer::getFullFileName(const std::string& approved,
                                       const std::string& extensionWithDot) const
    {
        std::stringstream ext;
        ext << getDirectory() << getOutputFileBaseName() << approved << extensionWithDot;
        return ext.str();
    }